

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O1

int Curl_resolv_timeout(connectdata *conn,char *hostname,int port,Curl_dns_entry **entry,
                       time_t timeoutms)

{
  Curl_easy *data;
  bool bVar1;
  Curl_addrinfo *cahead;
  _Bool _Var2;
  int iVar3;
  CURLcode CVar4;
  uint uVar5;
  Curl_dns_entry *pCStack_48;
  Curl_addrinfo *pCStack_40;
  int iStack_34;
  
  *entry = (Curl_dns_entry *)0x0;
  if (timeoutms < 0) {
    return -2;
  }
  pCStack_48 = (Curl_dns_entry *)0x0;
  data = conn->data;
  *entry = (Curl_dns_entry *)0x0;
  if (data->share != (Curl_share *)0x0) {
    Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
  }
  pCStack_48 = fetch_addr(conn,hostname,port);
  if (pCStack_48 == (Curl_dns_entry *)0x0) {
    uVar5 = 0xffffffff;
  }
  else {
    uVar5 = 0;
    Curl_infof(data,"Hostname %s was found in DNS cache\n",hostname);
    pCStack_48->inuse = pCStack_48->inuse + 1;
  }
  if (data->share != (Curl_share *)0x0) {
    Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
  }
  if (pCStack_48 != (Curl_dns_entry *)0x0) goto LAB_0010b658;
  _Var2 = Curl_ipvalid(conn);
  if (_Var2) {
    if ((data->set).resolver_start != (curl_resolver_start_callback)0x0) {
      Curl_set_in_callback(data,true);
      iVar3 = (*(data->set).resolver_start)
                        ((data->state).resolver,(void *)0x0,(data->set).resolver_start_client);
      pCStack_40 = (Curl_addrinfo *)CONCAT44(pCStack_40._4_4_,iVar3);
      Curl_set_in_callback(data,false);
      if ((int)pCStack_40 != 0) goto LAB_0010b64b;
    }
    pCStack_40 = Curl_getaddrinfo(conn,hostname,port,&iStack_34);
    if (pCStack_40 == (Curl_addrinfo *)0x0) {
      bVar1 = true;
      if (iStack_34 != 0) {
        CVar4 = Curl_resolver_is_resolved(conn,&pCStack_48);
        if (CVar4 != CURLE_OK) goto LAB_0010b64b;
        uVar5 = (uint)(pCStack_48 == (Curl_dns_entry *)0x0);
      }
    }
    else {
      if (data->share != (Curl_share *)0x0) {
        Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
      }
      cahead = pCStack_40;
      pCStack_48 = Curl_cache_addr(data,pCStack_40,hostname,port);
      if (data->share != (Curl_share *)0x0) {
        Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
      }
      bVar1 = true;
      if (pCStack_48 == (Curl_dns_entry *)0x0) {
        Curl_freeaddrinfo(cahead);
      }
      else {
        uVar5 = 0;
      }
    }
  }
  else {
LAB_0010b64b:
    bVar1 = false;
  }
  if (!bVar1) {
    return -1;
  }
LAB_0010b658:
  *entry = pCStack_48;
  return uVar5;
}

Assistant:

int Curl_resolv_timeout(struct connectdata *conn,
                        const char *hostname,
                        int port,
                        struct Curl_dns_entry **entry,
                        time_t timeoutms)
{
#ifdef USE_ALARM_TIMEOUT
#ifdef HAVE_SIGACTION
  struct sigaction keep_sigact;   /* store the old struct here */
  volatile bool keep_copysig = FALSE; /* whether old sigact has been saved */
  struct sigaction sigact;
#else
#ifdef HAVE_SIGNAL
  void (*keep_sigact)(int);       /* store the old handler here */
#endif /* HAVE_SIGNAL */
#endif /* HAVE_SIGACTION */
  volatile long timeout;
  volatile unsigned int prev_alarm = 0;
  struct Curl_easy *data = conn->data;
#endif /* USE_ALARM_TIMEOUT */
  int rc;

  *entry = NULL;

  if(timeoutms < 0)
    /* got an already expired timeout */
    return CURLRESOLV_TIMEDOUT;

#ifdef USE_ALARM_TIMEOUT
  if(data->set.no_signal)
    /* Ignore the timeout when signals are disabled */
    timeout = 0;
  else
    timeout = (timeoutms > LONG_MAX) ? LONG_MAX : (long)timeoutms;

  if(!timeout)
    /* USE_ALARM_TIMEOUT defined, but no timeout actually requested */
    return Curl_resolv(conn, hostname, port, entry);

  if(timeout < 1000) {
    /* The alarm() function only provides integer second resolution, so if
       we want to wait less than one second we must bail out already now. */
    failf(data,
        "remaining timeout of %ld too small to resolve via SIGALRM method",
        timeout);
    return CURLRESOLV_TIMEDOUT;
  }
  /* This allows us to time-out from the name resolver, as the timeout
     will generate a signal and we will siglongjmp() from that here.
     This technique has problems (see alarmfunc).
     This should be the last thing we do before calling Curl_resolv(),
     as otherwise we'd have to worry about variables that get modified
     before we invoke Curl_resolv() (and thus use "volatile"). */
  if(sigsetjmp(curl_jmpenv, 1)) {
    /* this is coming from a siglongjmp() after an alarm signal */
    failf(data, "name lookup timed out");
    rc = CURLRESOLV_ERROR;
    goto clean_up;
  }
  else {
    /*************************************************************
     * Set signal handler to catch SIGALRM
     * Store the old value to be able to set it back later!
     *************************************************************/
#ifdef HAVE_SIGACTION
    sigaction(SIGALRM, NULL, &sigact);
    keep_sigact = sigact;
    keep_copysig = TRUE; /* yes, we have a copy */
    sigact.sa_handler = alarmfunc;
#ifdef SA_RESTART
    /* HPUX doesn't have SA_RESTART but defaults to that behaviour! */
    sigact.sa_flags &= ~SA_RESTART;
#endif
    /* now set the new struct */
    sigaction(SIGALRM, &sigact, NULL);
#else /* HAVE_SIGACTION */
    /* no sigaction(), revert to the much lamer signal() */
#ifdef HAVE_SIGNAL
    keep_sigact = signal(SIGALRM, alarmfunc);
#endif
#endif /* HAVE_SIGACTION */

    /* alarm() makes a signal get sent when the timeout fires off, and that
       will abort system calls */
    prev_alarm = alarm(curlx_sltoui(timeout/1000L));
  }

#else
#ifndef CURLRES_ASYNCH
  if(timeoutms)
    infof(conn->data, "timeout on name lookup is not supported\n");
#else
  (void)timeoutms; /* timeoutms not used with an async resolver */
#endif
#endif /* USE_ALARM_TIMEOUT */

  /* Perform the actual name resolution. This might be interrupted by an
   * alarm if it takes too long.
   */
  rc = Curl_resolv(conn, hostname, port, entry);

#ifdef USE_ALARM_TIMEOUT
clean_up:

  if(!prev_alarm)
    /* deactivate a possibly active alarm before uninstalling the handler */
    alarm(0);

#ifdef HAVE_SIGACTION
  if(keep_copysig) {
    /* we got a struct as it looked before, now put that one back nice
       and clean */
    sigaction(SIGALRM, &keep_sigact, NULL); /* put it back */
  }
#else
#ifdef HAVE_SIGNAL
  /* restore the previous SIGALRM handler */
  signal(SIGALRM, keep_sigact);
#endif
#endif /* HAVE_SIGACTION */

  /* switch back the alarm() to either zero or to what it was before minus
     the time we spent until now! */
  if(prev_alarm) {
    /* there was an alarm() set before us, now put it back */
    timediff_t elapsed_secs = Curl_timediff(Curl_now(),
                                            conn->created) / 1000;

    /* the alarm period is counted in even number of seconds */
    unsigned long alarm_set = prev_alarm - elapsed_secs;

    if(!alarm_set ||
       ((alarm_set >= 0x80000000) && (prev_alarm < 0x80000000)) ) {
      /* if the alarm time-left reached zero or turned "negative" (counted
         with unsigned values), we should fire off a SIGALRM here, but we
         won't, and zero would be to switch it off so we never set it to
         less than 1! */
      alarm(1);
      rc = CURLRESOLV_TIMEDOUT;
      failf(data, "Previous alarm fired off!");
    }
    else
      alarm((unsigned int)alarm_set);
  }
#endif /* USE_ALARM_TIMEOUT */

  return rc;
}